

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O2

double anon_unknown.dwarf_22ffc::RiemannR_inverse<double>(double x)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = 0.0;
  if (1.0 <= x) {
    if ((x < 1.0) || (2.0 <= x)) {
      if ((x < 2.0) || (3.0 <= x)) {
        dVar3 = log(x);
        dVar4 = log(dVar3);
        dVar6 = dVar3 + dVar4 * 0.5;
        if (1600.0 < x) {
          dVar6 = dVar6 + (dVar4 + -2.0) / dVar3 + dVar4 * 0.5 + -1.0;
        }
        if (1200000.0 < x) {
          dVar6 = dVar6 - (dVar4 * dVar4 + dVar4 * -6.0 + 11.0) / ((dVar3 + dVar3) * dVar3);
        }
        dVar6 = dVar6 * x;
      }
      else {
        dVar6 = 3.0;
      }
    }
    else {
      dVar6 = 2.0;
    }
    iVar1 = 10;
    dVar3 = INFINITY;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      dVar4 = RiemannR<double>(dVar6);
      dVar5 = log(dVar6);
      dVar5 = dVar5 * (dVar4 - x);
      if (ABS(dVar3) <= ABS(dVar5)) {
        return dVar6;
      }
      dVar6 = dVar6 - dVar5;
      dVar3 = dVar5;
    }
  }
  return dVar6;
}

Assistant:

T RiemannR_inverse(T x)
{
  if (x < 1)
    return 0;

  T t = initialNthPrimeApprox(x);
  T old_term = pstd::numeric_limits<T>::infinity();

  // The condition i < ITERS is required in case the computation
  // does not converge. This happened on Linux i386 where
  // the precision of the libc math functions is very limited.
  for (int i = 0; i < 10; i++)
  {
    // term = f(t) / f'(t)
    // f(t) = RiemannR(t) - x
    // RiemannR(t) ~ li(t), hence f'(t) = li'(t) = 1 / log(t)
    // term = (RiemannR(t) - x) / li'(t) = (RiemannR(t) - x) * log(t)
    T term = (RiemannR(t) - x) * std::log(t);

    // Not converging anymore
    if (std::abs(term) >= std::abs(old_term))
      break;

    t -= term;
    old_term = term;
  }

  return t;
}